

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O2

ErrorGenerator * JsonErrors::EXPECTED_TYPE(ErrorGenerator *__return_storage_ptr__,string *type)

{
  string *this;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)type);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,asStack_38);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.cxx:18:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.cxx:18:10)>
       ::_M_manager;
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator EXPECTED_TYPE(const std::string& type)
{
  return [type](const Json::Value* value, cmJSONState* state) -> void {
    if (state->key().empty()) {
      state->AddErrorAtValue(cmStrCat("Expected ", type), value);
      return;
    }
    std::string errMsg = cmStrCat("\"", state->key(), "\" expected ", type);
    if (value && value->isConvertibleTo(Json::ValueType::stringValue)) {
      errMsg = cmStrCat(errMsg, ", got: ", value->asString());
    }
    state->AddErrorAtValue(errMsg, value);
  };
}